

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

void __thiscall re2::Tester::~Tester(Tester *this)

{
  TestInstance *this_00;
  size_type sVar1;
  reference ppTVar2;
  ulong local_18;
  size_t i;
  Tester *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>::size(&this->v_);
    if (sVar1 <= local_18) break;
    ppTVar2 = std::vector<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>::operator[]
                        (&this->v_,local_18);
    this_00 = *ppTVar2;
    if (this_00 != (TestInstance *)0x0) {
      TestInstance::~TestInstance(this_00);
      operator_delete(this_00);
    }
    local_18 = local_18 + 1;
  }
  std::vector<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>::~vector(&this->v_);
  return;
}

Assistant:

Tester::~Tester() {
  for (size_t i = 0; i < v_.size(); i++)
    delete v_[i];
}